

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall
SQFuncState::SetIntructionParam(SQFuncState *this,SQInteger pos,SQInteger arg,SQInteger val)

{
  uchar uVar1;
  SQInstruction *pSVar2;
  SQInteger val_local;
  SQInteger arg_local;
  SQInteger pos_local;
  SQFuncState *this_local;
  
  uVar1 = (uchar)val;
  switch(arg) {
  case 0:
    pSVar2 = sqvector<SQInstruction>::operator[](&this->_instructions,pos);
    pSVar2->_arg0 = uVar1;
    break;
  case 1:
  case 4:
    pSVar2 = sqvector<SQInstruction>::operator[](&this->_instructions,pos);
    pSVar2->_arg1 = (SQInt32)val;
    break;
  case 2:
    pSVar2 = sqvector<SQInstruction>::operator[](&this->_instructions,pos);
    pSVar2->_arg2 = uVar1;
    break;
  case 3:
    pSVar2 = sqvector<SQInstruction>::operator[](&this->_instructions,pos);
    pSVar2->_arg3 = uVar1;
  }
  return;
}

Assistant:

void SQFuncState::SetIntructionParam(SQInteger pos,SQInteger arg,SQInteger val)
{
    switch(arg){
        case 0:_instructions[pos]._arg0=(unsigned char)*((SQUnsignedInteger *)&val);break;
        case 1:case 4:_instructions[pos]._arg1=(SQInt32)*((SQUnsignedInteger *)&val);break;
        case 2:_instructions[pos]._arg2=(unsigned char)*((SQUnsignedInteger *)&val);break;
        case 3:_instructions[pos]._arg3=(unsigned char)*((SQUnsignedInteger *)&val);break;
    };
}